

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * fmt::v6::detail::
       parse_align<char,fmt::v6::detail::specs_checker<fmt::v6::detail::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::detail::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v6::detail::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::detail::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>_>
                 *handler)

{
  byte bVar1;
  basic_format_specs<char> *pbVar2;
  char *in_RAX;
  byte *pbVar3;
  byte *pbVar4;
  format_error *this;
  ulong uVar5;
  char *unaff_RBX;
  byte bVar6;
  bool bVar7;
  size_t i;
  ulong uVar8;
  bool bVar9;
  
  if (begin == end) {
    assert_fail(unaff_RBX,0,in_RAX);
  }
  pbVar4 = (byte *)(begin + 1);
  pbVar3 = pbVar4;
  if ((*begin < '\0') && (pbVar3 = (byte *)end, pbVar4 != (byte *)end)) {
    pbVar3 = pbVar4;
  }
  if (pbVar3 == (byte *)end) {
    pbVar3 = (byte *)begin;
  }
  do {
    bVar1 = *pbVar3;
    bVar7 = true;
    bVar9 = false;
    if (bVar1 < 0x3e) {
      if (bVar1 == 0x3c) {
        bVar6 = 1;
        goto LAB_0010df6a;
      }
      bVar6 = 0;
      if (bVar1 == 0x3d) {
        bVar6 = 4;
        bVar9 = true;
        bVar7 = false;
      }
    }
    else {
      if (bVar1 == 0x3e) {
        bVar6 = 2;
      }
      else {
        bVar6 = 0;
        if (bVar1 != 0x5e) goto LAB_0010df70;
        bVar6 = 3;
      }
LAB_0010df6a:
      bVar7 = false;
      bVar9 = false;
    }
LAB_0010df70:
    if (!bVar7) {
      pbVar4 = (byte *)begin;
      if (pbVar3 != (byte *)begin) {
        if (*begin == '{') {
          error_handler::on_error((error_handler *)begin,"invalid fill character \'{\'");
        }
        uVar5 = (long)pbVar3 - (long)begin;
        if ((long)uVar5 < 0) {
          assert_fail(unaff_RBX,0,in_RAX);
        }
        if (4 < uVar5) {
          this = (format_error *)__cxa_allocate_exception(0x10);
          format_error::format_error(this,"invalid fill");
          __cxa_throw(this,&format_error::typeinfo,format_error::~format_error);
        }
        pbVar2 = (handler->
                 super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::detail::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
                 ).super_specs_setter<char>.specs_;
        uVar8 = 0;
        do {
          (pbVar2->fill).data_[uVar8] = begin[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar5 != uVar8);
        (pbVar2->fill).size_ = (uchar)uVar5;
        pbVar4 = pbVar3;
      }
      if ((bVar9) && (10 < (handler->checker_).arg_type_ - int_type)) {
        error_handler::on_error((error_handler *)begin,"format specifier requires numeric argument")
        ;
      }
      pbVar2 = (handler->
               super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::detail::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
               ).super_specs_setter<char>.specs_;
      pbVar2->field_0x9 = pbVar2->field_0x9 & 0xf0 | bVar6;
      return (char *)(pbVar4 + 1);
    }
    bVar9 = pbVar3 == (byte *)begin;
    pbVar3 = (byte *)begin;
    if (bVar9) {
      return begin;
    }
  } while( true );
}

Assistant:

FMT_CONSTEXPR const Char* parse_align(const Char* begin, const Char* end,
                                      Handler&& handler) {
  FMT_ASSERT(begin != end, "");
  auto align = align::none;
  auto p = next_code_point(begin, end);
  if (p == end) p = begin;
  for (;;) {
    switch (static_cast<char>(*p)) {
    case '<':
      align = align::left;
      break;
    case '>':
      align = align::right;
      break;
#if FMT_NUMERIC_ALIGN
    case '=':
      align = align::numeric;
      break;
#endif
    case '^':
      align = align::center;
      break;
    }
    if (align != align::none) {
      if (p != begin) {
        auto c = *begin;
        if (c == '{')
          return handler.on_error("invalid fill character '{'"), begin;
        handler.on_fill(basic_string_view<Char>(begin, to_unsigned(p - begin)));
        begin = p + 1;
      } else
        ++begin;
      handler.on_align(align);
      break;
    } else if (p == begin) {
      break;
    }
    p = begin;
  }
  return begin;
}